

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::ModelDescription::ByteSizeLong(ModelDescription *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  Type *pTVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  uVar7 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  uVar8 = (ulong)uVar7;
  uVar10 = 0;
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  else {
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(this->input_).super_RepeatedPtrFieldBase,uVar10);
      sVar5 = FeatureDescription::ByteSizeLong(pTVar4);
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar8 = uVar8 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  uVar7 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar9 = uVar8 + uVar7;
  if ((ulong)uVar7 != 0) {
    uVar10 = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(this->output_).super_RepeatedPtrFieldBase,uVar10);
      sVar5 = FeatureDescription::ByteSizeLong(pTVar4);
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar9 = lVar9 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  uVar7 = (this->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = lVar9 + (ulong)uVar7 * 2;
  if ((ulong)uVar7 != 0) {
    uVar10 = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(this->traininginput_).super_RepeatedPtrFieldBase,uVar10);
      sVar6 = FeatureDescription::ByteSizeLong(pTVar4);
      uVar3 = (uint)sVar6 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  sVar1 = ((this->predictedfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar7 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->predictedprobabilitiesname_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar7 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->metadata_ != (Metadata *)0x0 &&
      this != (ModelDescription *)&_ModelDescription_default_instance_) {
    sVar6 = Metadata::ByteSizeLong(this->metadata_);
    uVar7 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t ModelDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ModelDescription)
  size_t total_size = 0;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  {
    unsigned int count = this->input_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->input(i));
    }
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  {
    unsigned int count = this->output_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->output(i));
    }
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  {
    unsigned int count = this->traininginput_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->traininginput(i));
    }
  }

  // string predictedFeatureName = 11;
  if (this->predictedfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->predictedfeaturename());
  }

  // string predictedProbabilitiesName = 12;
  if (this->predictedprobabilitiesname().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->predictedprobabilitiesname());
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->has_metadata()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->metadata_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}